

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_IterMulti_Test::TestBody(DBTest_IterMulti_Test *this)

{
  DB *pDVar1;
  undefined8 *puVar2;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar3;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  int iVar5;
  undefined4 extraout_var;
  AssertionResult *this_00;
  char *pcVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_18;
  undefined1 local_b0 [32];
  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [23];
  undefined1 local_69;
  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  AssertionResult local_58;
  undefined1 local_48;
  undefined7 uStack_47;
  int local_40 [2];
  undefined4 uStack_38;
  undefined4 uStack_34;
  Iterator *iter;
  
  local_b0._0_8_ = (long)local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a","");
  local_90.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"va","");
  local_48 = 0;
  local_68.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_b0._0_8_;
  _Stack_60._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_b0._8_8_;
  local_40[0] = (int)local_90.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
  local_40[1] = local_90.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_;
  uStack_38 = uStack_88;
  uStack_34 = uStack_84;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_58);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_68,(char *)local_40
             ,(Status *)"Put(\"a\", \"va\")");
  if ((void *)CONCAT71(local_58._1_7_,local_58.success_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_58._1_7_,local_58.success_));
  }
  if (local_90.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_80) {
    operator_delete((void *)local_90.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10))
  {
    operator_delete((void *)local_b0._0_8_);
  }
  PVar3 = local_68.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_;
  if (local_68.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_60._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)_Stack_60._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x33d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
  }
  _Var4._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )_Stack_60;
  if (_Stack_60._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)
            _Stack_60._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)_Stack_60._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)
                       _Stack_60._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    }
    operator_delete((void *)_Var4._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if (PVar3 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    return;
  }
  local_b0._0_8_ = (long)local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"b","");
  local_90.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"vb","");
  local_48 = 0;
  local_68.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_b0._0_8_;
  _Stack_60._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_b0._8_8_;
  local_40[0] = (int)local_90.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
  local_40[1] = local_90.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_;
  uStack_38 = uStack_88;
  uStack_34 = uStack_84;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_58);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_68,(char *)local_40
             ,(Status *)"Put(\"b\", \"vb\")");
  if ((void *)CONCAT71(local_58._1_7_,local_58.success_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_58._1_7_,local_58.success_));
  }
  if (local_90.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_80) {
    operator_delete((void *)local_90.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10))
  {
    operator_delete((void *)local_b0._0_8_);
  }
  PVar3 = local_68.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_;
  if (local_68.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_60._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)_Stack_60._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x33e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
  }
  _Var4._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )_Stack_60;
  if (_Stack_60._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)
            _Stack_60._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)_Stack_60._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)
                       _Stack_60._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    }
    operator_delete((void *)_Var4._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if (PVar3 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    return;
  }
  local_b0._0_8_ = (long)local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"c","");
  local_90.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"vc","");
  local_48 = 0;
  local_68.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_b0._0_8_;
  _Stack_60._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_b0._8_8_;
  local_40[0] = (int)local_90.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
  local_40[1] = local_90.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_;
  uStack_38 = uStack_88;
  uStack_34 = uStack_84;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_58);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_68,(char *)local_40
             ,(Status *)"Put(\"c\", \"vc\")");
  if ((void *)CONCAT71(local_58._1_7_,local_58.success_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_58._1_7_,local_58.success_));
  }
  if (local_90.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_80) {
    operator_delete((void *)local_90.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10))
  {
    operator_delete((void *)local_b0._0_8_);
  }
  PVar3 = local_68.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_;
  if (local_68.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_60._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)_Stack_60._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x33f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
  }
  _Var4._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )_Stack_60;
  if (_Stack_60._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)
            _Stack_60._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)_Stack_60._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)
                       _Stack_60._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    }
    operator_delete((void *)_Var4._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if (PVar3 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    return;
  }
  local_b0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x100;
  iVar5 = (*((this->super_DBTest).db_)->_vptr_DB[6])();
  iter = (Iterator *)CONCAT44(extraout_var,iVar5);
  (*iter->_vptr_Iterator[3])(iter);
  DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_90,"IterStatus(iter)","\"a->va\"",(string *)local_b0,
             (char (*) [6])"a->va");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10))
  {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
    }
    iVar5 = 0x343;
LAB_00119650:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,iVar5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
    puVar2 = (undefined8 *)CONCAT44(uStack_84,uStack_88);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    return;
  }
  puVar2 = (undefined8 *)CONCAT44(uStack_84,uStack_88);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  (*iter->_vptr_Iterator[6])(iter);
  DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_90,"IterStatus(iter)","\"b->vb\"",(string *)local_b0,
             (char (*) [6])"b->vb");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10))
  {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
    }
    iVar5 = 0x345;
    goto LAB_00119650;
  }
  puVar2 = (undefined8 *)CONCAT44(uStack_84,uStack_88);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  (*iter->_vptr_Iterator[6])(iter);
  DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_90,"IterStatus(iter)","\"c->vc\"",(string *)local_b0,
             (char (*) [6])"c->vc");
  if (local_b0._0_8_ != (long)local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (local_90.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
    }
    iVar5 = 0x347;
  }
  else {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
    (*iter->_vptr_Iterator[6])(iter);
    DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
              ((internal *)&local_90,"IterStatus(iter)","\"(invalid)\"",(string *)local_b0,
               (char (*) [10])"(invalid)");
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10)
       ) {
      operator_delete((void *)local_b0._0_8_);
    }
    if (local_90.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)local_b0);
      if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
      }
      iVar5 = 0x349;
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
      (*iter->_vptr_Iterator[3])(iter);
      DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                ((internal *)&local_90,"IterStatus(iter)","\"a->va\"",(string *)local_b0,
                 (char (*) [6])"a->va");
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_);
      }
      if (local_90.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (string)0x0) {
        testing::Message::Message((Message *)local_b0);
        if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
        }
        iVar5 = 0x34b;
      }
      else {
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
        (*iter->_vptr_Iterator[7])(iter);
        DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                  ((internal *)&local_90,"IterStatus(iter)","\"(invalid)\"",(string *)local_b0,
                   (char (*) [10])"(invalid)");
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b0._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
        if (local_90.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (string)0x0) {
          testing::Message::Message((Message *)local_b0);
          if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
          }
          iVar5 = 0x34d;
        }
        else {
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
          (*iter->_vptr_Iterator[4])(iter);
          DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                    ((internal *)&local_90,"IterStatus(iter)","\"c->vc\"",(string *)local_b0,
                     (char (*) [6])"c->vc");
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_b0._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_b0 + 0x10)) {
            operator_delete((void *)local_b0._0_8_);
          }
          if (local_90.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ == (string)0x0) {
            testing::Message::Message((Message *)local_b0);
            if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
            }
            iVar5 = 0x350;
          }
          else {
            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
            (*iter->_vptr_Iterator[7])(iter);
            DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                      ((internal *)&local_90,"IterStatus(iter)","\"b->vb\"",(string *)local_b0,
                       (char (*) [6])"b->vb");
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_b0._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_b0 + 0x10)) {
              operator_delete((void *)local_b0._0_8_);
            }
            if (local_90.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)local_b0);
              if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
              }
              iVar5 = 0x352;
            }
            else {
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
              (*iter->_vptr_Iterator[7])(iter);
              DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
              testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                        ((internal *)&local_90,"IterStatus(iter)","\"a->va\"",(string *)local_b0,
                         (char (*) [6])"a->va");
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_b0._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_b0 + 0x10)) {
                operator_delete((void *)local_b0._0_8_);
              }
              if (local_90.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_1_ == (string)0x0) {
                testing::Message::Message((Message *)local_b0);
                if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                }
                iVar5 = 0x354;
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
                (*iter->_vptr_Iterator[7])(iter);
                DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
                testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                          ((internal *)&local_90,"IterStatus(iter)","\"(invalid)\"",
                           (string *)local_b0,(char (*) [10])"(invalid)");
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_b0._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_b0 + 0x10)) {
                  operator_delete((void *)local_b0._0_8_);
                }
                if (local_90.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_1_ == (string)0x0) {
                  testing::Message::Message((Message *)local_b0);
                  if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                  }
                  iVar5 = 0x356;
                }
                else {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
                  (*iter->_vptr_Iterator[4])(iter);
                  DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
                  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                            ((internal *)&local_90,"IterStatus(iter)","\"c->vc\"",(string *)local_b0
                             ,(char (*) [6])"c->vc");
                  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_b0._0_8_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_b0 + 0x10)) {
                    operator_delete((void *)local_b0._0_8_);
                  }
                  if (local_90.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._0_1_ == (string)0x0) {
                    testing::Message::Message((Message *)local_b0);
                    if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                    }
                    iVar5 = 0x358;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
                    (*iter->_vptr_Iterator[6])(iter);
                    DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
                    testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                              ((internal *)&local_90,"IterStatus(iter)","\"(invalid)\"",
                               (string *)local_b0,(char (*) [10])"(invalid)");
                    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b0._0_8_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_b0 + 0x10)) {
                      operator_delete((void *)local_b0._0_8_);
                    }
                    if (local_90.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._0_1_ == (string)0x0) {
                      testing::Message::Message((Message *)local_b0);
                      if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                        pcVar6 = "";
                      }
                      else {
                        pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                      }
                      iVar5 = 0x35a;
                    }
                    else {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
                      pcVar6 = "";
                      local_b0._0_8_ = "";
                      local_b0._8_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      (*iter->_vptr_Iterator[5])(iter);
                      DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
                      testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                ((internal *)&local_90,"IterStatus(iter)","\"a->va\"",
                                 (string *)local_b0,(char (*) [6])"a->va");
                      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_b0._0_8_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )(local_b0 + 0x10)) {
                        operator_delete((void *)local_b0._0_8_);
                      }
                      if (local_90.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._0_1_ == (string)0x0) {
                        testing::Message::Message((Message *)local_b0);
                        if ((undefined8 *)CONCAT44(uStack_84,uStack_88) != (undefined8 *)0x0) {
                          pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                        }
                        iVar5 = 0x35d;
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
                        local_b0._0_8_ = "a";
                        local_b0._8_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x1;
                        (*iter->_vptr_Iterator[5])(iter);
                        DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter);
                        testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                  ((internal *)&local_90,"IterStatus(iter)","\"a->va\"",
                                   (string *)local_b0,(char (*) [6])"a->va");
                        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)local_b0._0_8_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)(local_b0 + 0x10)) {
                          operator_delete((void *)local_b0._0_8_);
                        }
                        if (local_90.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._0_1_ == (string)0x0) {
                          testing::Message::Message((Message *)local_b0);
                          if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                            pcVar6 = "";
                          }
                          else {
                            pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                          }
                          iVar5 = 0x35f;
                        }
                        else {
                          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90);
                          local_b0._0_8_ = "ax";
                          local_b0._8_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2;
                          (*iter->_vptr_Iterator[5])(iter);
                          DBTest::IterStatus_abi_cxx11_((string *)local_b0,&this->super_DBTest,iter)
                          ;
                          testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                    ((internal *)&local_90,"IterStatus(iter)","\"b->vb\"",
                                     (string *)local_b0,(char (*) [6])"b->vb");
                          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)local_b0._0_8_ !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)(local_b0 + 0x10)) {
                            operator_delete((void *)local_b0._0_8_);
                          }
                          if (local_90.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._0_1_ == (string)0x0) {
                            testing::Message::Message((Message *)local_b0);
                            if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0) {
                              pcVar6 = "";
                            }
                            else {
                              pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                            }
                            iVar5 = 0x361;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_90)
                            ;
                            local_b0._0_8_ = "b";
                            local_b0._8_8_ =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x1;
                            (*iter->_vptr_Iterator[5])(iter);
                            DBTest::IterStatus_abi_cxx11_
                                      ((string *)local_b0,&this->super_DBTest,iter);
                            testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                      ((internal *)&local_90,"IterStatus(iter)","\"b->vb\"",
                                       (string *)local_b0,(char (*) [6])"b->vb");
                            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)local_b0._0_8_ !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)(local_b0 + 0x10)) {
                              operator_delete((void *)local_b0._0_8_);
                            }
                            if (local_90.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_1_ == (string)0x0) {
                              testing::Message::Message((Message *)local_b0);
                              if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0)
                              {
                                pcVar6 = "";
                              }
                              else {
                                pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                              }
                              iVar5 = 0x363;
                            }
                            else {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_90);
                              local_b0._0_8_ = "z";
                              local_b0._8_8_ =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x1;
                              (*iter->_vptr_Iterator[5])(iter);
                              DBTest::IterStatus_abi_cxx11_
                                        ((string *)local_b0,&this->super_DBTest,iter);
                              testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                                        ((internal *)&local_90,"IterStatus(iter)","\"(invalid)\"",
                                         (string *)local_b0,(char (*) [10])"(invalid)");
                              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0._0_8_ !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_b0 + 0x10)) {
                                operator_delete((void *)local_b0._0_8_);
                              }
                              if (local_90.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_1_ == (string)0x0) {
                                testing::Message::Message((Message *)local_b0);
                                if ((undefined8 *)CONCAT44(uStack_84,uStack_88) == (undefined8 *)0x0
                                   ) {
                                  pcVar6 = "";
                                }
                                else {
                                  pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                                }
                                iVar5 = 0x365;
                              }
                              else {
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)&local_90);
                                (*iter->_vptr_Iterator[4])(iter);
                                (*iter->_vptr_Iterator[7])(iter);
                                (*iter->_vptr_Iterator[7])(iter);
                                (*iter->_vptr_Iterator[6])(iter);
                                DBTest::IterStatus_abi_cxx11_
                                          ((string *)local_b0,&this->super_DBTest,iter);
                                testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                          ((internal *)&local_90,"IterStatus(iter)","\"b->vb\"",
                                           (string *)local_b0,(char (*) [6])"b->vb");
                                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0._0_8_ !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_b0 + 0x10)) {
                                  operator_delete((void *)local_b0._0_8_);
                                }
                                if (local_90.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._0_1_ == (string)0x0) {
                                  testing::Message::Message((Message *)local_b0);
                                  if ((undefined8 *)CONCAT44(uStack_84,uStack_88) ==
                                      (undefined8 *)0x0) {
                                    pcVar6 = "";
                                  }
                                  else {
                                    pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                                  }
                                  iVar5 = 0x36c;
                                }
                                else {
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)&local_90);
                                  (*iter->_vptr_Iterator[3])(iter);
                                  (*iter->_vptr_Iterator[6])(iter);
                                  (*iter->_vptr_Iterator[6])(iter);
                                  (*iter->_vptr_Iterator[7])(iter);
                                  DBTest::IterStatus_abi_cxx11_
                                            ((string *)local_b0,&this->super_DBTest,iter);
                                  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                                            ((internal *)&local_90,"IterStatus(iter)","\"b->vb\"",
                                             (string *)local_b0,(char (*) [6])"b->vb");
                                  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b0._0_8_ !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(local_b0 + 0x10)) {
                                    operator_delete((void *)local_b0._0_8_);
                                  }
                                  if (local_90.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._0_1_ != (string)0x0) {
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)&local_90);
                                    local_b0._0_8_ = (long)local_b0 + 0x10;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_b0,"a","");
                                    local_90.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )local_80;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_90,"va2","");
                                    local_69 = 0;
                                    local_68.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )local_b0._0_8_;
                                    _Stack_60._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )local_b0._8_8_;
                                    local_40[0] = (int)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                    local_40[1] = local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_;
                                    uStack_38 = uStack_88;
                                    uStack_34 = uStack_84;
                                    (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_48);
                                    testing::internal::
                                    PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                    operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                *)&local_58,(char *)&local_68,
                                               (Status *)"Put(\"a\", \"va2\")");
                                    if ((void *)CONCAT71(uStack_47,local_48) != (void *)0x0) {
                                      operator_delete__((void *)CONCAT71(uStack_47,local_48));
                                    }
                                    if (local_90.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl !=
                                        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )local_80) {
                                      operator_delete((void *)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    }
                                    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b0._0_8_ !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(local_b0 + 0x10)) {
                                      operator_delete((void *)local_b0._0_8_);
                                    }
                                    if (local_58.success_ == false) {
                                      testing::Message::Message((Message *)local_b0);
                                      if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           )local_58.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           )0x0) {
                                        pcVar6 = "";
                                      }
                                      else {
                                        pcVar6 = ((_Alloc_hider *)
                                                 local_58.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl)->_M_p;
                                      }
                                      iVar5 = 0x376;
                                    }
                                    else {
                                      testing::AssertionResult::~AssertionResult(&local_58);
                                      local_b0._0_8_ = (long)local_b0 + 0x10;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_b0,"a2","");
                                      local_90.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl =
                                           (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )local_80;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_90,"va3","");
                                      local_69 = 0;
                                      local_68.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl =
                                           (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )local_b0._0_8_;
                                      _Stack_60._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl =
                                           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )local_b0._8_8_;
                                      local_40[0] = (int)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      local_40[1] = local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_;
                                      uStack_38 = uStack_88;
                                      uStack_34 = uStack_84;
                                      (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_48);
                                      testing::internal::
                                      PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                      operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)&local_58,(char *)&local_68,
                                                 (Status *)"Put(\"a2\", \"va3\")");
                                      if ((void *)CONCAT71(uStack_47,local_48) != (void *)0x0) {
                                        operator_delete__((void *)CONCAT71(uStack_47,local_48));
                                      }
                                      if (local_90.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl !=
                                          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )local_80) {
                                        operator_delete((void *)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                      }
                                      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b0._0_8_ !=
                                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(local_b0 + 0x10)) {
                                        operator_delete((void *)local_b0._0_8_);
                                      }
                                      if (local_58.success_ == false) {
                                        testing::Message::Message((Message *)local_b0);
                                        if (local_58.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          pcVar6 = "";
                                        }
                                        else {
                                          pcVar6 = ((_Alloc_hider *)
                                                   local_58.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl)->_M_p;
                                        }
                                        iVar5 = 0x377;
                                      }
                                      else {
                                        testing::AssertionResult::~AssertionResult(&local_58);
                                        local_b0._0_8_ = (long)local_b0 + 0x10;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_b0,"b","");
                                        local_90.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl =
                                             (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )local_80;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_90,"vb2","");
                                        local_69 = 0;
                                        local_68.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl =
                                             (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )local_b0._0_8_;
                                        _Stack_60._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl =
                                             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )local_b0._8_8_;
                                        local_40[0] = (int)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                        local_40[1] = local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_;
                                        uStack_38 = uStack_88;
                                        uStack_34 = uStack_84;
                                        (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_48);
                                        testing::internal::
                                        PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                        operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)&local_58,(char *)&local_68,
                                                  (Status *)"Put(\"b\", \"vb2\")");
                                        if ((void *)CONCAT71(uStack_47,local_48) != (void *)0x0) {
                                          operator_delete__((void *)CONCAT71(uStack_47,local_48));
                                        }
                                        if (local_90.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl !=
                                            (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )local_80) {
                                          operator_delete((void *)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                        }
                                        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_b0._0_8_ !=
                                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(local_b0 + 0x10)) {
                                          operator_delete((void *)local_b0._0_8_);
                                        }
                                        if (local_58.success_ == false) {
                                          testing::Message::Message((Message *)local_b0);
                                          if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )local_58.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar6 = "";
                                          }
                                          else {
                                            pcVar6 = *(char **)local_58.message_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                          }
                                          iVar5 = 0x378;
                                        }
                                        else {
                                          testing::AssertionResult::~AssertionResult(&local_58);
                                          local_b0._0_8_ = (long)local_b0 + 0x10;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)local_b0,"c","");
                                          local_90.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl =
                                               (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )local_80;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_90,"vc2","");
                                          local_69 = 0;
                                          local_68.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl =
                                               (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )local_b0._0_8_;
                                          _Stack_60._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl =
                                               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )local_b0._8_8_;
                                          local_40[0] = (int)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                          local_40[1] = local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_;
                                          uStack_38 = uStack_88;
                                          uStack_34 = uStack_84;
                                          (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_48);
                                          testing::internal::
                                          PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                          ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)&local_58,(char *)&local_68,
                                                  (Status *)"Put(\"c\", \"vc2\")");
                                          if ((void *)CONCAT71(uStack_47,local_48) != (void *)0x0) {
                                            operator_delete__((void *)CONCAT71(uStack_47,local_48));
                                          }
                                          if (local_90.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl !=
                                              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               )local_80) {
                                            operator_delete((void *)local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                          }
                                          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_b0._0_8_ !=
                                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(local_b0 + 0x10)) {
                                            operator_delete((void *)local_b0._0_8_);
                                          }
                                          if (local_58.success_ != false) {
                                            testing::AssertionResult::~AssertionResult(&local_58);
                                            local_b0._0_8_ = (long)local_b0 + 0x10;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)local_b0,"b","");
                                            pDVar1 = (this->super_DBTest).db_;
                                            local_58.success_ = false;
                                            local_90.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl =
                                                 (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )(
                                                  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )local_b0._0_8_;
                                            uStack_88 = local_b0._8_4_;
                                            uStack_84 = local_b0._12_4_;
                                            (*pDVar1->_vptr_DB[3])(local_40,pDVar1,&local_58);
                                            testing::internal::
                                            PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                            ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)&local_68,(char *)&local_90,
                                                  (Status *)"Delete(\"b\")");
                                            if ((void *)CONCAT44(local_40[1],local_40[0]) !=
                                                (void *)0x0) {
                                              operator_delete__((void *)CONCAT44(local_40[1],
                                                                                 local_40[0]));
                                            }
                                            if (local_b0._0_8_ != (long)local_b0 + 0x10) {
                                              operator_delete((void *)local_b0._0_8_);
                                            }
                                            if (local_68.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._0_1_ ==
                                                (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                 )0x0) {
                                              testing::Message::Message((Message *)local_b0);
                                              if ((
                                                  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )_Stack_60._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar6 = "";
                                              }
                                              else {
                                                pcVar6 = *(char **)_Stack_60._M_t.
                                                                                                                                      
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&local_90,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                                  ,0x37a,pcVar6);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&local_90,
                                                         (Message *)local_b0);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&local_90);
                                              if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                (**(code **)(*(long *)local_b0._0_8_ + 8))();
                                              }
                                              this_00 = (AssertionResult *)&local_68;
                                              goto LAB_00119957;
                                            }
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)&local_68);
                                            (*iter->_vptr_Iterator[3])(iter);
                                            DBTest::IterStatus_abi_cxx11_
                                                      ((string *)local_b0,&this->super_DBTest,iter);
                                            testing::internal::
                                            CmpHelperEQ<std::__cxx11::string,char[6]>
                                                      ((internal *)&local_90,"IterStatus(iter)",
                                                       "\"a->va\"",(string *)local_b0,
                                                       (char (*) [6])"a->va");
                                            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_b0._0_8_ !=
                                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(local_b0 + 0x10)) {
                                              operator_delete((void *)local_b0._0_8_);
                                            }
                                            if (local_90.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._0_1_ == (string)0x0) {
                                              testing::Message::Message((Message *)local_b0);
                                              if ((undefined8 *)CONCAT44(uStack_84,uStack_88) ==
                                                  (undefined8 *)0x0) {
                                                pcVar6 = "";
                                              }
                                              else {
                                                pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                                              }
                                              iVar5 = 0x37c;
                                            }
                                            else {
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)&local_90);
                                              (*iter->_vptr_Iterator[6])(iter);
                                              DBTest::IterStatus_abi_cxx11_
                                                        ((string *)local_b0,&this->super_DBTest,iter
                                                        );
                                              testing::internal::
                                              CmpHelperEQ<std::__cxx11::string,char[6]>
                                                        ((internal *)&local_90,"IterStatus(iter)",
                                                         "\"b->vb\"",(string *)local_b0,
                                                         (char (*) [6])"b->vb");
                                              if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                operator_delete((void *)local_b0._0_8_);
                                              }
                                              if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ == (string)0x0) {
                                                testing::Message::Message((Message *)local_b0);
                                                if ((undefined8 *)CONCAT44(uStack_84,uStack_88) ==
                                                    (undefined8 *)0x0) {
                                                  pcVar6 = "";
                                                }
                                                else {
                                                  pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                                                }
                                                iVar5 = 0x37e;
                                              }
                                              else {
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)&local_90);
                                                (*iter->_vptr_Iterator[6])(iter);
                                                DBTest::IterStatus_abi_cxx11_
                                                          ((string *)local_b0,&this->super_DBTest,
                                                           iter);
                                                testing::internal::
                                                CmpHelperEQ<std::__cxx11::string,char[6]>
                                                          ((internal *)&local_90,"IterStatus(iter)",
                                                           "\"c->vc\"",(string *)local_b0,
                                                           (char (*) [6])"c->vc");
                                                if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                  operator_delete((void *)local_b0._0_8_);
                                                }
                                                if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ == (string)0x0) {
                                                  testing::Message::Message((Message *)local_b0);
                                                  if ((undefined8 *)CONCAT44(uStack_84,uStack_88) ==
                                                      (undefined8 *)0x0) {
                                                    pcVar6 = "";
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88)
                                                    ;
                                                  }
                                                  iVar5 = 0x380;
                                                }
                                                else {
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)&local_90);
                                                  (*iter->_vptr_Iterator[6])(iter);
                                                  DBTest::IterStatus_abi_cxx11_
                                                            ((string *)local_b0,&this->super_DBTest,
                                                             iter);
                                                  testing::internal::
                                                  CmpHelperEQ<std::__cxx11::string,char[10]>
                                                            ((internal *)&local_90,
                                                             "IterStatus(iter)","\"(invalid)\"",
                                                             (string *)local_b0,
                                                             (char (*) [10])"(invalid)");
                                                  if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                    operator_delete((void *)local_b0._0_8_);
                                                  }
                                                  if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ == (string)0x0) {
                                                    testing::Message::Message((Message *)local_b0);
                                                    if ((undefined8 *)CONCAT44(uStack_84,uStack_88)
                                                        == (undefined8 *)0x0) {
                                                      pcVar6 = "";
                                                    }
                                                    else {
                                                      pcVar6 = *(char **)CONCAT44(uStack_84,
                                                                                  uStack_88);
                                                    }
                                                    iVar5 = 0x382;
                                                  }
                                                  else {
                                                    testing::AssertionResult::~AssertionResult
                                                              ((AssertionResult *)&local_90);
                                                    (*iter->_vptr_Iterator[4])(iter);
                                                    DBTest::IterStatus_abi_cxx11_
                                                              ((string *)local_b0,
                                                               &this->super_DBTest,iter);
                                                    testing::internal::
                                                    CmpHelperEQ<std::__cxx11::string,char[6]>
                                                              ((internal *)&local_90,
                                                               "IterStatus(iter)","\"c->vc\"",
                                                               (string *)local_b0,
                                                               (char (*) [6])"c->vc");
                                                    if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                    operator_delete((void *)local_b0._0_8_);
                                                  }
                                                  if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ == (string)0x0) {
                                                    testing::Message::Message((Message *)local_b0);
                                                    if ((undefined8 *)CONCAT44(uStack_84,uStack_88)
                                                        == (undefined8 *)0x0) {
                                                      pcVar6 = "";
                                                    }
                                                    else {
                                                      pcVar6 = *(char **)CONCAT44(uStack_84,
                                                                                  uStack_88);
                                                    }
                                                    iVar5 = 900;
                                                  }
                                                  else {
                                                    testing::AssertionResult::~AssertionResult
                                                              ((AssertionResult *)&local_90);
                                                    (*iter->_vptr_Iterator[7])(iter);
                                                    DBTest::IterStatus_abi_cxx11_
                                                              ((string *)local_b0,
                                                               &this->super_DBTest,iter);
                                                    testing::internal::
                                                    CmpHelperEQ<std::__cxx11::string,char[6]>
                                                              ((internal *)&local_90,
                                                               "IterStatus(iter)","\"b->vb\"",
                                                               (string *)local_b0,
                                                               (char (*) [6])"b->vb");
                                                    if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                    operator_delete((void *)local_b0._0_8_);
                                                  }
                                                  if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ == (string)0x0) {
                                                    testing::Message::Message((Message *)local_b0);
                                                    if ((undefined8 *)CONCAT44(uStack_84,uStack_88)
                                                        == (undefined8 *)0x0) {
                                                      pcVar6 = "";
                                                    }
                                                    else {
                                                      pcVar6 = *(char **)CONCAT44(uStack_84,
                                                                                  uStack_88);
                                                    }
                                                    iVar5 = 0x386;
                                                  }
                                                  else {
                                                    testing::AssertionResult::~AssertionResult
                                                              ((AssertionResult *)&local_90);
                                                    (*iter->_vptr_Iterator[7])(iter);
                                                    DBTest::IterStatus_abi_cxx11_
                                                              ((string *)local_b0,
                                                               &this->super_DBTest,iter);
                                                    testing::internal::
                                                    CmpHelperEQ<std::__cxx11::string,char[6]>
                                                              ((internal *)&local_90,
                                                               "IterStatus(iter)","\"a->va\"",
                                                               (string *)local_b0,
                                                               (char (*) [6])"a->va");
                                                    if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                    operator_delete((void *)local_b0._0_8_);
                                                  }
                                                  if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ == (string)0x0) {
                                                    testing::Message::Message((Message *)local_b0);
                                                    if ((undefined8 *)CONCAT44(uStack_84,uStack_88)
                                                        == (undefined8 *)0x0) {
                                                      pcVar6 = "";
                                                    }
                                                    else {
                                                      pcVar6 = *(char **)CONCAT44(uStack_84,
                                                                                  uStack_88);
                                                    }
                                                    iVar5 = 0x388;
                                                  }
                                                  else {
                                                    testing::AssertionResult::~AssertionResult
                                                              ((AssertionResult *)&local_90);
                                                    (*iter->_vptr_Iterator[7])(iter);
                                                    DBTest::IterStatus_abi_cxx11_
                                                              ((string *)local_b0,
                                                               &this->super_DBTest,iter);
                                                    testing::internal::
                                                    CmpHelperEQ<std::__cxx11::string,char[10]>
                                                              ((internal *)&local_90,
                                                               "IterStatus(iter)","\"(invalid)\"",
                                                               (string *)local_b0,
                                                               (char (*) [10])"(invalid)");
                                                    if ((
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0._0_8_ !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_b0 + 0x10)) {
                                                    operator_delete((void *)local_b0._0_8_);
                                                  }
                                                  if (local_90.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_1_ != (string)0x0) {
                                                    testing::AssertionResult::~AssertionResult
                                                              ((AssertionResult *)&local_90);
                                                    (*iter->_vptr_Iterator[1])(iter);
                                                    return;
                                                  }
                                                  testing::Message::Message((Message *)local_b0);
                                                  if ((undefined8 *)CONCAT44(uStack_84,uStack_88) ==
                                                      (undefined8 *)0x0) {
                                                    pcVar6 = "";
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88)
                                                    ;
                                                  }
                                                  iVar5 = 0x38a;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            goto LAB_00119927;
                                          }
                                          testing::Message::Message((Message *)local_b0);
                                          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )local_58.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl ==
                                              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )0x0) {
                                            pcVar6 = "";
                                          }
                                          else {
                                            pcVar6 = *(char **)local_58.message_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                          }
                                          iVar5 = 0x379;
                                        }
                                      }
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&local_90,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                               ,iVar5,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&local_90,(Message *)local_b0);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&local_90);
                                    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b0._0_8_ !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      (**(code **)(*(long *)local_b0._0_8_ + 8))();
                                    }
                                    this_00 = &local_58;
                                    goto LAB_00119957;
                                  }
                                  testing::Message::Message((Message *)local_b0);
                                  if ((undefined8 *)CONCAT44(uStack_84,uStack_88) ==
                                      (undefined8 *)0x0) {
                                    pcVar6 = "";
                                  }
                                  else {
                                    pcVar6 = *(char **)CONCAT44(uStack_84,uStack_88);
                                  }
                                  iVar5 = 0x373;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00119927:
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_68,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,iVar5,pcVar6);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_b0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b0._0_8_ + 8))();
  }
  this_00 = (AssertionResult *)&local_90;
LAB_00119957:
  testing::AssertionResult::~AssertionResult(this_00);
  return;
}

Assistant:

TEST_F(DBTest, IterMulti) {
  ASSERT_LEVELDB_OK(Put("a", "va"));
  ASSERT_LEVELDB_OK(Put("b", "vb"));
  ASSERT_LEVELDB_OK(Put("c", "vc"));
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("a");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("ax");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("b");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("z");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  // Switch from reverse to forward
  iter->SeekToLast();
  iter->Prev();
  iter->Prev();
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Switch from forward to reverse
  iter->SeekToFirst();
  iter->Next();
  iter->Next();
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Make sure iter stays at snapshot
  ASSERT_LEVELDB_OK(Put("a", "va2"));
  ASSERT_LEVELDB_OK(Put("a2", "va3"));
  ASSERT_LEVELDB_OK(Put("b", "vb2"));
  ASSERT_LEVELDB_OK(Put("c", "vc2"));
  ASSERT_LEVELDB_OK(Delete("b"));
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}